

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O0

void duckdb_je_emap_remap(tsdn_t *tsdn,emap_t *emap,edata_t *edata,szind_t szind,_Bool slab)

{
  long lVar1;
  ulong uVar2;
  _Bool _Var3;
  extent_state_t eVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  int in_ECX;
  edata_t *in_RDX;
  long in_RDI;
  byte in_R8B;
  uintptr_t key;
  rtree_contents_t contents;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_leaf_elm_t *elm_1;
  uintptr_t subkey_5;
  rtree_leaf_elm_t *leaf_5;
  uint i_1;
  uintptr_t subkey_4;
  rtree_leaf_elm_t *leaf_4;
  uintptr_t subkey_3;
  rtree_leaf_elm_t *leaf_3;
  uintptr_t leafkey_1;
  size_t slot_1;
  rtree_leaf_elm_t *elm;
  uintptr_t subkey_2;
  rtree_leaf_elm_t *leaf_2;
  uint i;
  uintptr_t subkey_1;
  rtree_leaf_elm_t *leaf_1;
  uintptr_t subkey;
  rtree_leaf_elm_t *leaf;
  uintptr_t leafkey;
  size_t slot;
  uint additional;
  void *bits;
  uint additional_1;
  void *bits_1;
  uint8_t state;
  uintptr_t mask;
  uintptr_t mask_4;
  uintptr_t mask_1;
  uint maskbits;
  uint shiftbits;
  uint cumbits_2;
  uint ptrbits_2;
  uintptr_t mask_2;
  uint maskbits_1;
  uint shiftbits_1;
  uint cumbits_3;
  uint ptrbits_3;
  uintptr_t mask_3;
  uint maskbits_2;
  uint shiftbits_2;
  uint cumbits_4;
  uint ptrbits_4;
  uintptr_t mask_5;
  uint maskbits_3;
  uint shiftbits_3;
  uint cumbits_7;
  uint ptrbits_7;
  uintptr_t mask_6;
  uint maskbits_4;
  uint shiftbits_4;
  uint cumbits_8;
  uint ptrbits_8;
  uintptr_t mask_7;
  uint maskbits_5;
  uint shiftbits_5;
  uint cumbits_9;
  uint ptrbits_9;
  uint cumbits_6;
  uint ptrbits_6;
  uint cumbits_1;
  uint ptrbits_1;
  uint cumbits_5;
  uint ptrbits_5;
  uint cumbits;
  uint ptrbits;
  uintptr_t metadata_bits;
  uintptr_t state_bits;
  uintptr_t is_head_bits;
  uintptr_t slab_bits;
  uintptr_t szind_bits;
  uintptr_t edata_bits;
  uintptr_t metadata_bits_1;
  uintptr_t state_bits_1;
  uintptr_t is_head_bits_1;
  uintptr_t slab_bits_1;
  uintptr_t szind_bits_1;
  uintptr_t edata_bits_1;
  undefined4 in_stack_fffffffffffff8d0;
  undefined4 in_stack_fffffffffffff8d4;
  undefined4 uStack_6ce;
  undefined1 in_stack_fffffffffffff936;
  undefined1 in_stack_fffffffffffff937;
  rtree_ctx_t *key_00;
  rtree_ctx_t *in_stack_fffffffffffff940;
  rtree_t *in_stack_fffffffffffff948;
  tsdn_t *in_stack_fffffffffffff950;
  rtree_ctx_t *local_510;
  uint local_4ac;
  rtree_leaf_elm_t *local_450;
  uint local_3ec;
  rtree_leaf_elm_t *local_390;
  undefined4 local_36c;
  undefined1 local_368 [8];
  rtree_leaf_elm_t *local_360;
  undefined1 local_2e1;
  void *local_2c8;
  ulong local_2c0;
  undefined8 local_2b8;
  void *local_2b0;
  undefined8 local_2a8;
  ulong local_2a0;
  undefined8 local_298;
  uint local_28c;
  undefined4 local_288;
  uint local_284;
  undefined4 local_280;
  undefined4 local_27c;
  void *local_278;
  undefined8 local_270;
  uint local_264;
  undefined4 local_260;
  uint local_25c;
  undefined4 local_258;
  undefined4 local_254;
  void *local_250;
  undefined8 local_248;
  uint local_23c;
  undefined4 local_238;
  uint local_234;
  undefined4 local_230;
  undefined4 local_22c;
  void *local_228;
  undefined4 local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 local_18c;
  long lStack_150;
  ulong local_148;
  undefined4 *local_138;
  undefined1 *local_130;
  undefined4 local_dc;
  void *local_d8;
  rtree_leaf_elm_t *local_d0;
  undefined4 local_b4;
  void *local_b0;
  rtree_leaf_elm_t *local_a8;
  undefined4 local_a0;
  undefined4 uStack_9c;
  long lStack_90;
  ulong local_88;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  byte local_38;
  
  local_510 = (rtree_ctx_t *)&stack0xfffffffffffff940;
  if (in_RDI == 0) {
    duckdb_je_rtree_ctx_data_init(local_510);
  }
  else {
    local_2e1 = *(undefined1 *)(in_RDI + 0x338);
    local_510 = (rtree_ctx_t *)(in_RDI + 0x1b8);
  }
  if (in_ECX != 0xe8) {
    _Var3 = edata_is_head_get(in_RDX);
    eVar4 = edata_state_get(in_RDX);
    key_00 = local_510;
    pvVar5 = edata_addr_get(in_RDX);
    lVar1 = CONCAT44(eVar4,in_ECX);
    uVar2 = CONCAT17(in_stack_fffffffffffff937,
                     CONCAT16(in_stack_fffffffffffff936,CONCAT42(uStack_6ce,CONCAT11(in_R8B,_Var3)))
                    ) & 0xffffffffffff01ff;
    local_18c = 0x40;
    local_190 = 0x22;
    uVar6 = (ulong)pvVar5 >> 0x1e & 0xf;
    local_19c = 0x40;
    local_1a0 = 0x22;
    local_2b8 = 0xffffffffc0000000;
    uVar7 = (ulong)pvVar5 & 0xffffffffc0000000;
    local_2c8 = pvVar5;
    local_2b0 = pvVar5;
    if (local_510->cache[uVar6].leafkey == uVar7) {
      local_27c = 1;
      local_280 = 0x40;
      local_284 = 0x34;
      local_288 = 0xc;
      local_28c = 0x12;
      local_298 = 0x3ffff;
      local_390 = local_510->cache[uVar6].leaf + ((ulong)pvVar5 >> 0xc & 0x3ffff);
      local_278 = pvVar5;
    }
    else if (local_510->l2_cache[0].leafkey == uVar7) {
      local_390 = local_510->l2_cache[0].leaf;
      local_510->l2_cache[0].leafkey = local_510->cache[uVar6].leafkey;
      local_510->l2_cache[0].leaf = local_510->cache[uVar6].leaf;
      local_510->cache[uVar6].leafkey = uVar7;
      local_510->cache[uVar6].leaf = local_390;
      local_254 = 1;
      local_258 = 0x40;
      local_25c = 0x34;
      local_260 = 0xc;
      local_264 = 0x12;
      local_270 = 0x3ffff;
      local_390 = local_390 + ((ulong)pvVar5 >> 0xc & 0x3ffff);
      local_250 = pvVar5;
    }
    else {
      for (local_3ec = 1; local_3ec < 8; local_3ec = local_3ec + 1) {
        if (local_510->l2_cache[local_3ec].leafkey == uVar7) {
          local_390 = local_510->l2_cache[local_3ec].leaf;
          if (local_3ec == 0) {
            local_510->l2_cache[0].leafkey = local_510->cache[uVar6].leafkey;
            local_510->l2_cache[0].leaf = local_510->cache[uVar6].leaf;
          }
          else {
            local_510->l2_cache[local_3ec].leafkey = local_510->l2_cache[local_3ec - 1].leafkey;
            local_510->l2_cache[local_3ec].leaf = local_510->l2_cache[local_3ec - 1].leaf;
            local_510->l2_cache[local_3ec - 1].leafkey = local_510->cache[uVar6].leafkey;
            local_510->l2_cache[local_3ec - 1].leaf = local_510->cache[uVar6].leaf;
          }
          local_510->cache[uVar6].leafkey = uVar7;
          local_510->cache[uVar6].leaf = local_390;
          local_22c = 1;
          local_230 = 0x40;
          local_234 = 0x34;
          local_238 = 0xc;
          local_23c = 0x12;
          local_248 = 0x3ffff;
          local_390 = local_390 + ((ulong)pvVar5 >> 0xc & 0x3ffff);
          local_228 = pvVar5;
          goto LAB_025155fb;
        }
      }
      local_390 = duckdb_je_rtree_leaf_elm_lookup_hard
                            (in_stack_fffffffffffff950,in_stack_fffffffffffff948,
                             in_stack_fffffffffffff940,(uintptr_t)key_00,
                             (_Bool)in_stack_fffffffffffff937,(_Bool)in_stack_fffffffffffff936);
    }
LAB_025155fb:
    if (local_390 != (rtree_leaf_elm_t *)0x0) {
      local_360 = local_390;
      local_130 = local_368;
      local_138 = &local_36c;
      local_50 = (ulong)in_RDX & 0xffffffffffff;
      local_58 = lVar1 << 0x30;
      local_60 = uVar2 >> 8 & 0xff;
      local_88._0_1_ = (byte)uVar2;
      local_68 = (ulong)((uint)(byte)local_88 * 2);
      local_70 = (ulong)eVar4 << 2;
      local_78 = local_58 | local_70 | local_68 | local_60;
      local_d8 = (void *)(local_50 | local_78);
      local_d0 = local_390;
      local_dc = local_36c;
      local_a8 = local_390;
      local_b4 = 2;
      local_a0 = 2;
      uStack_9c = 3;
      (local_390->le_bits).repr = local_d8;
      lStack_150 = lVar1;
      local_148 = uVar2;
      local_b0 = local_d8;
      lStack_90 = lVar1;
      local_88 = uVar2;
    }
    if (((in_R8B & 1) != 0) && (sVar8 = edata_size_get(in_RDX), 0x1000 < sVar8)) {
      pvVar5 = edata_past_get((edata_t *)
                              CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      uVar6 = (long)pvVar5 - 0x1000;
      uVar2 = CONCAT17(in_stack_fffffffffffff937,
                       CONCAT16(in_stack_fffffffffffff936,
                                CONCAT42(uStack_6ce,CONCAT11(in_R8B,_Var3)))) & 0xffffffffffff01ff;
      local_194 = 0x40;
      local_198 = 0x22;
      uVar7 = uVar6 >> 0x1e & 0xf;
      local_1a4 = 0x40;
      local_1a8 = 0x22;
      local_2a8 = 0xffffffffc0000000;
      uVar9 = uVar6 & 0xffffffffc0000000;
      if (key_00->cache[uVar7].leafkey == uVar9) {
        local_450 = key_00->cache[uVar7].leaf + (uVar6 >> 0xc & 0x3ffff);
      }
      else if (key_00->l2_cache[0].leafkey == uVar9) {
        local_450 = key_00->l2_cache[0].leaf;
        key_00->l2_cache[0].leafkey = key_00->cache[uVar7].leafkey;
        key_00->l2_cache[0].leaf = key_00->cache[uVar7].leaf;
        key_00->cache[uVar7].leafkey = uVar9;
        key_00->cache[uVar7].leaf = local_450;
        local_450 = local_450 + (uVar6 >> 0xc & 0x3ffff);
      }
      else {
        for (local_4ac = 1; local_4ac < 8; local_4ac = local_4ac + 1) {
          if (key_00->l2_cache[local_4ac].leafkey == uVar9) {
            local_450 = key_00->l2_cache[local_4ac].leaf;
            if (local_4ac == 0) {
              key_00->l2_cache[0].leafkey = key_00->cache[uVar7].leafkey;
              key_00->l2_cache[0].leaf = key_00->cache[uVar7].leaf;
            }
            else {
              key_00->l2_cache[local_4ac].leafkey = key_00->l2_cache[local_4ac - 1].leafkey;
              key_00->l2_cache[local_4ac].leaf = key_00->l2_cache[local_4ac - 1].leaf;
              key_00->l2_cache[local_4ac - 1].leafkey = key_00->cache[uVar7].leafkey;
              key_00->l2_cache[local_4ac - 1].leaf = key_00->cache[uVar7].leaf;
            }
            key_00->cache[uVar7].leafkey = uVar9;
            key_00->cache[uVar7].leaf = local_450;
            local_450 = local_450 + (uVar6 >> 0xc & 0x3ffff);
            goto LAB_0251609c;
          }
        }
        local_2c0 = uVar6;
        local_2a0 = uVar6;
        local_450 = duckdb_je_rtree_leaf_elm_lookup_hard
                              (in_stack_fffffffffffff950,in_stack_fffffffffffff948,
                               in_stack_fffffffffffff940,(uintptr_t)key_00,
                               (_Bool)in_stack_fffffffffffff937,(_Bool)in_stack_fffffffffffff936);
      }
LAB_0251609c:
      if (local_450 != (rtree_leaf_elm_t *)0x0) {
        local_38 = (byte)uVar2;
        (local_450->le_bits).repr =
             (void *)((ulong)in_RDX & 0xffffffffffff |
                     CONCAT44(eVar4,in_ECX) << 0x30 | (ulong)eVar4 << 2 |
                     (ulong)((uint)local_38 * 2) | uVar2 >> 8 & 0xff);
      }
    }
  }
  return;
}

Assistant:

void
emap_remap(tsdn_t *tsdn, emap_t *emap, edata_t *edata, szind_t szind,
    bool slab) {
	EMAP_DECLARE_RTREE_CTX;

	if (szind != SC_NSIZES) {
		rtree_contents_t contents;
		contents.edata = edata;
		contents.metadata.szind = szind;
		contents.metadata.slab = slab;
		contents.metadata.is_head = edata_is_head_get(edata);
		contents.metadata.state = edata_state_get(edata);

		rtree_write(tsdn, &emap->rtree, rtree_ctx,
		    (uintptr_t)edata_addr_get(edata), contents);
		/*
		 * Recall that this is called only for active->inactive and
		 * inactive->active transitions (since only active extents have
		 * meaningful values for szind and slab).  Active, non-slab
		 * extents only need to handle lookups at their head (on
		 * deallocation), so we don't bother filling in the end
		 * boundary.
		 *
		 * For slab extents, we do the end-mapping change.  This still
		 * leaves the interior unmodified; an emap_register_interior
		 * call is coming in those cases, though.
		 */
		if (slab && edata_size_get(edata) > PAGE) {
			uintptr_t key = (uintptr_t)edata_past_get(edata)
			    - (uintptr_t)PAGE;
			rtree_write(tsdn, &emap->rtree, rtree_ctx, key,
			    contents);
		}
	}
}